

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cn-get.c
# Opt level: O0

cn_cbor * cn_cbor_mapget_string(cn_cbor *cb,char *key)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  cn_cbor *pcStack_28;
  int keylen;
  cn_cbor *cp;
  char *key_local;
  cn_cbor *cb_local;
  
  if (cb == (cn_cbor *)0x0) {
    __assert_fail("cb",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/cn-cbor/repo/src/cn-get.c"
                  ,0x24,"cn_cbor *cn_cbor_mapget_string(const cn_cbor *, const char *)");
  }
  if (key != (char *)0x0) {
    sVar2 = strlen(key);
    pcStack_28 = cb->first_child;
    while( true ) {
      bVar3 = false;
      if (pcStack_28 != (cn_cbor *)0x0) {
        bVar3 = pcStack_28->next != (cn_cbor *)0x0;
      }
      if (!bVar3) break;
      if (((pcStack_28->type == CN_CBOR_BYTES || pcStack_28->type == CN_CBOR_TEXT) &&
          ((int)sVar2 == pcStack_28->length)) &&
         (iVar1 = memcmp(key,(pcStack_28->v).bytes,(long)(int)sVar2), iVar1 == 0)) {
        return pcStack_28->next;
      }
      pcStack_28 = pcStack_28->next->next;
    }
    return (cn_cbor *)0x0;
  }
  __assert_fail("key",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/cn-cbor/repo/src/cn-get.c"
                ,0x25,"cn_cbor *cn_cbor_mapget_string(const cn_cbor *, const char *)");
}

Assistant:

MYLIB_EXPORT
cn_cbor* cn_cbor_mapget_string(const cn_cbor* cb, const char* key) {
  cn_cbor *cp;
  int keylen;
  assert(cb);
  assert(key);
  keylen = strlen(key);
  for (cp = cb->first_child; cp && cp->next; cp = cp->next->next) {
    switch(cp->type) {
    case CN_CBOR_TEXT: // fall-through
    case CN_CBOR_BYTES:
      if (keylen != cp->length) {
        continue;
      }
      if (memcmp(key, cp->v.str, keylen) == 0) {
        return cp->next;
      }
    default:
      ; // skip non-string keys
    }
  }
  return NULL;
}